

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqdebug.cpp
# Opt level: O0

void __thiscall SQVM::Raise_CompareError(SQVM *this,SQObject *o1,SQObject *o2)

{
  SQString *pSVar1;
  SQObjectPtr local_70;
  undefined1 local_60 [8];
  SQObjectPtr oval2;
  SQObjectPtr local_40;
  undefined1 local_30 [8];
  SQObjectPtr oval1;
  SQObject *o2_local;
  SQObject *o1_local;
  SQVM *this_local;
  
  oval1.super_SQObject._unVal = (SQObjectValue)o2;
  ::SQObjectPtr::SQObjectPtr(&local_40,o1);
  pSVar1 = PrintObjVal(this,&local_40);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_30,pSVar1);
  ::SQObjectPtr::~SQObjectPtr(&local_40);
  ::SQObjectPtr::SQObjectPtr(&local_70,(SQObject *)oval1.super_SQObject._unVal.pTable);
  pSVar1 = PrintObjVal(this,&local_70);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_60,pSVar1);
  ::SQObjectPtr::~SQObjectPtr(&local_70);
  Raise_Error(this,"comparison between \'%.50s\' and \'%.50s\'",oval1.super_SQObject._0_8_ + 0x38,
              oval2.super_SQObject._0_8_ + 0x38);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_60);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_30);
  return;
}

Assistant:

void SQVM::Raise_CompareError(const SQObject &o1, const SQObject &o2)
{
    SQObjectPtr oval1 = PrintObjVal(o1), oval2 = PrintObjVal(o2);
    Raise_Error(_SC("comparison between '%.50s' and '%.50s'"), _stringval(oval1), _stringval(oval2));
}